

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_next.c
# Opt level: O2

mpt_node * mpt_node_next(mpt_node *curr,char *ident)

{
  int iVar1;
  size_t sVar2;
  void *__s2;
  ulong uVar3;
  
  if (ident == (char *)0x0) {
    uVar3 = 0;
  }
  else {
    sVar2 = strlen(ident);
    uVar3 = sVar2 + 1;
  }
  do {
    if (curr == (mpt_node *)0x0) {
      return (mpt_node *)0x0;
    }
    __s2 = mpt_identifier_data(&curr->ident);
    if ((uVar3 == (curr->ident)._len) && ((curr->ident)._charset == '\x01')) {
      if (uVar3 == 0) {
        return curr;
      }
      iVar1 = bcmp(ident,__s2,uVar3 - 1);
      if (iVar1 == 0) {
        return curr;
      }
    }
    curr = curr->next;
  } while( true );
}

Assistant:

extern MPT_STRUCT(node) *mpt_node_next(const MPT_STRUCT(node) *curr, const char *ident)
{
	size_t idlen;
	
	idlen = ident ? strlen(ident) + 1 : 0;
	
	while (curr) {
		const void *cid;
		size_t clen;
		
		cid  = mpt_identifier_data(&curr->ident);
		clen = curr->ident._len;
		if (idlen == clen
		    && curr->ident._charset == MPT_CHARSET(UTF8)
		    && (!idlen || !memcmp(ident, cid, idlen - 1))) {
			return (MPT_STRUCT(node) *) curr;
		}
		curr = curr->next;
	}
	return 0;
}